

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O1

void __thiscall
skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
::skiplist(skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  this->last = (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  (this->key).
  super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key).
  super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->key).
           super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->key).
           super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->mt_)._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar4 = 0x1571;
  lVar2 = 6;
  do {
    lVar3 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d;
    uVar4 = lVar3 + lVar1;
    (this->mt_)._M_x[lVar2 + -5] = (lVar2 + lVar3) - 5;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13d);
  (this->mt_)._M_p = 0x138;
  (this->dist_)._M_param._M_a = 0.0;
  (this->dist_)._M_param._M_b = 1.0;
  _setup_random_number_generator(this);
  return;
}

Assistant:

skiplist() : size_(0), last(nullptr) {_setup_random_number_generator();}